

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,string *targetName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,string *newLineCharacter,mode_t permissions,bool inputIsContent)

{
  undefined1 local_48 [15];
  undefined1 local_39 [8];
  bool inputIsContent_local;
  string *newLineCharacter_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *condition_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *outputName_local;
  string *targetName_local;
  string *inputFile_local;
  cmMakefile *this_local;
  
  local_39[0] = (_Alloc_hider)inputIsContent;
  unique0x1000009b = newLineCharacter;
  newLineCharacter_local = (string *)condition;
  condition_local = outputName;
  outputName_local =
       (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        *)targetName;
  targetName_local = inputFile;
  inputFile_local = (string *)this;
  GetPolicyStatus(this,CMP0070,false);
  std::
  make_unique<cmGeneratorExpressionEvaluationFile,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,bool&,std::__cxx11::string_const&,unsigned_int&,cmPolicies::PolicyStatus>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,inputFile
             ,(unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)targetName,outputName,(bool *)condition,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39,
             (uint *)newLineCharacter,&permissions);
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ::push_back(&this->EvaluationFiles,(value_type *)local_48);
  std::
  unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
  ::~unique_ptr((unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
                 *)local_48);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile, const std::string& targetName,
  std::unique_ptr<cmCompiledGeneratorExpression> outputName,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  const std::string& newLineCharacter, mode_t permissions, bool inputIsContent)
{
  this->EvaluationFiles.push_back(
    cm::make_unique<cmGeneratorExpressionEvaluationFile>(
      inputFile, targetName, std::move(outputName), std::move(condition),
      inputIsContent, newLineCharacter, permissions,
      this->GetPolicyStatus(cmPolicies::CMP0070)));
}